

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2.cpp
# Opt level: O1

int8 * rw::ps2::getADCbitsForMesh(Geometry *geo,Mesh *mesh)

{
  long lVar1;
  int8 *piVar2;
  MeshHeader *pMVar3;
  uint uVar4;
  ulong uVar5;
  
  lVar1 = (long)adcOffset;
  if ((lVar1 == 0) || (*(int *)((long)geo->texCoords + lVar1 + -0x38) == 0)) {
    piVar2 = (int8 *)0x0;
  }
  else {
    piVar2 = *(int8 **)((long)geo->texCoords + lVar1 + -0x30);
  }
  if (piVar2 != (int8 *)0x0) {
    pMVar3 = geo->meshHeader;
    uVar4 = (int)((long)mesh + (-0x10 - (long)pMVar3) >> 3) * -0x55555555;
    if (0 < (int)uVar4) {
      uVar5 = (ulong)(uVar4 & 0x7fffffff);
      do {
        pMVar3 = (MeshHeader *)&pMVar3[1].totalIndices;
        piVar2 = piVar2 + *(uint *)pMVar3;
        uVar5 = uVar5 - 1;
      } while (uVar5 != 0);
    }
    return piVar2;
  }
  return (int8 *)0x0;
}

Assistant:

int8*
getADCbits(Geometry *geo)
{
	int8 *bits = nil;
	if(adcOffset){
		ADCData *adc = PLUGINOFFSET(ADCData, geo, adcOffset);
		if(adc->adcFormatted)
			bits = adc->adcBits;
	}
	return bits;
}